

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

string * __thiscall
helics::CoreBroker::query_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  BrokerBase *this_00;
  atomic<int> *paVar1;
  GlobalFederateId GVar2;
  string_view request;
  string_view request_00;
  bool bVar3;
  int iVar4;
  string *psVar5;
  int *__s1;
  ulong __n;
  action_t aVar6;
  char *pcVar7;
  undefined1 auVar8 [8];
  size_type __rlen;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  ActionMessage querycmd;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  undefined1 local_118 [8];
  json_value local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  data local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  SmallBuffer local_a8;
  
  local_128._M_str = queryStr._M_str;
  local_128._M_len = queryStr._M_len;
  __s1 = (int *)target._M_str;
  __n = target._M_len;
  this_00 = &this->super_BrokerBase;
  if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
    GVar2.gid = (this->super_BrokerBase).global_id._M_i.gid;
    if (__n == 6) {
      if ((short)__s1[1] == 0x7265 && *__s1 == 0x6b6f7262) goto LAB_0034c1b9;
      if ((this->super_BrokerBase).identifier._M_string_length == 6) goto LAB_0034c163;
LAB_0034c199:
      if ((__n >> 1 |
          (ulong)(((undefined1  [16])target & (undefined1  [16])0x1) != (undefined1  [16])0x0) <<
          0x3f) < 6) {
        psVar5 = (string *)(*(code *)(&DAT_00447288 + *(int *)(&DAT_00447288 + (__n >> 1) * 4)))();
        return psVar5;
      }
LAB_0034c33d:
      aVar6 = cmd_query_ordered;
      if (mode == HELICS_SEQUENCING_MODE_FAST) {
        aVar6 = cmd_query;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar6);
      local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,GVar2.gid);
      LOCK();
      paVar1 = &this->queryCounter;
      iVar4 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      iVar4 = iVar4 + 1;
      local_e8._4_4_ = iVar4;
      SmallBuffer::operator=(&local_a8,&local_128);
      ActionMessage::setStringData((ActionMessage *)local_e8,(string_view)target);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_118,(int)&this->activeQueries);
      transmitToParent(this,(ActionMessage *)local_e8);
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_118);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::finishedWithValue(&this->activeQueries,iVar4);
LAB_0034c6a5:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.object !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.object);
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      return __return_storage_ptr__;
    }
    if ((this->super_BrokerBase).identifier._M_string_length != __n) goto LAB_0034c199;
    if (__n == 0) {
LAB_0034c1b9:
      request._M_str = local_128._M_str;
      request._M_len = local_128._M_len;
      quickBrokerQueries_abi_cxx11_((string *)local_118,this,request);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.object !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_118._1_7_,local_118[0]) == &local_108) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_108._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p =
               (pointer)CONCAT71(local_118._1_7_,local_118[0]);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_108._M_allocated_capacity;
        }
LAB_0034c5e5:
        __return_storage_ptr__->_M_string_length = (size_type)local_110;
        return __return_storage_ptr__;
      }
      if ((local_128._M_len == 7) &&
         (*(int *)((long)(_Rb_tree_color *)local_128._M_str + 3) == 0x73736572 &&
          *(_Rb_tree_color *)local_128._M_str == 0x72646461)) {
        psVar5 = getAddress_abi_cxx11_(this);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump((string_t *)local_e8,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_f8,-1,' ',true,hex);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_f8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
        if (local_e8 != (undefined1  [8])local_d8) {
          operator_delete((void *)local_e8,
                          CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                                   (undefined4)local_d8[0]._M_allocated_capacity) + 1);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_118._1_7_,local_118[0]) == &local_108) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_108._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p =
               (pointer)CONCAT71(local_118._1_7_,local_118[0]);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_108._M_allocated_capacity;
        }
        goto LAB_0034c5e5;
      }
      aVar6 = cmd_broker_query_ordered;
      if (mode == HELICS_SEQUENCING_MODE_FAST) {
        aVar6 = cmd_broker_query;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar6);
      pcVar7 = local_128._M_str;
      local_a8.bufferSize = local_128._M_len;
      local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,GVar2.gid);
      LOCK();
      paVar1 = &this->queryCounter;
      iVar4 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      iVar4 = iVar4 + 1;
      local_e8._4_4_ = iVar4;
      local_d8[0]._0_4_ = GVar2.gid;
      if ((byte *)local_128._M_str == local_a8.heap) {
      }
      else {
        SmallBuffer::reserve(&local_a8,local_128._M_len);
        if (local_a8.bufferSize != 0) {
          memcpy(local_a8.heap,pcVar7,local_a8.bufferSize);
        }
      }
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8,(int)&this->activeQueries);
      BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_f8);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::finishedWithValue(&this->activeQueries,iVar4);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_value.object !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_value.object);
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      auVar8 = (undefined1  [8])CONCAT71(local_118._1_7_,local_118[0]);
      if (auVar8 == (undefined1  [8])&local_108) {
        return __return_storage_ptr__;
      }
      goto LAB_0034c5d2;
    }
LAB_0034c163:
    iVar4 = bcmp(__s1,(this->super_BrokerBase).identifier._M_dataplus._M_p,__n);
    if (iVar4 == 0) goto LAB_0034c1b9;
    if (__n == 4) {
      iVar4 = bcmp(__s1,"root",4);
joined_r0x0034c317:
      if (iVar4 == 0) {
        aVar6 = cmd_broker_query_ordered;
        if (mode == HELICS_SEQUENCING_MODE_FAST) {
          aVar6 = cmd_broker_query;
        }
        ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar6);
        pcVar7 = local_128._M_str;
        local_a8.bufferSize = local_128._M_len;
        local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,GVar2.gid);
        LOCK();
        paVar1 = &this->queryCounter;
        iVar4 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        iVar4 = iVar4 + 1;
        local_e8._4_4_ = iVar4;
        if ((byte *)local_128._M_str == local_a8.heap) {
        }
        else {
          SmallBuffer::reserve(&local_a8,local_128._M_len);
          if (local_a8.bufferSize != 0) {
            memcpy(local_a8.heap,pcVar7,local_a8.bufferSize);
          }
        }
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_118,(int)&this->activeQueries);
        transmitToParent(this,(ActionMessage *)local_e8);
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_118);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue(&this->activeQueries,iVar4);
        goto LAB_0034c6a5;
      }
      goto LAB_0034c33d;
    }
    if (__n == 10) {
      iVar4 = bcmp(__s1,"rootbroker",10);
      goto joined_r0x0034c317;
    }
    if (__n != 6) goto LAB_0034c33d;
    iVar4 = bcmp(__s1,"parent",6);
    if (iVar4 != 0) goto LAB_0034c33d;
    if ((this->super_BrokerBase).field_0x294 != '\x01') {
      aVar6 = cmd_broker_query_ordered;
      if (mode == HELICS_SEQUENCING_MODE_FAST) {
        aVar6 = cmd_broker_query;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar6);
      local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,GVar2.gid);
      LOCK();
      paVar1 = &this->queryCounter;
      local_e8._4_4_ = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      local_e8._4_4_ = local_e8._4_4_ + 1;
      SmallBuffer::operator=(&local_a8,&local_128);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_118,(int)&this->activeQueries);
      BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_118);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::finishedWithValue(&this->activeQueries,local_e8._4_4_);
      goto LAB_0034c6a5;
    }
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"broker has no parent","");
    generateJsonErrorResponse((string *)__return_storage_ptr__,NOT_FOUND,(string *)local_e8);
  }
  else {
    if (__n == 6) {
      if ((short)__s1[1] == 0x7265 && *__s1 == 0x6b6f7262) goto LAB_0034c48a;
      if ((this->super_BrokerBase).identifier._M_string_length == 6) {
LAB_0034c128:
        iVar4 = bcmp(__s1,(this->super_BrokerBase).identifier._M_dataplus._M_p,__n);
        if (iVar4 == 0) goto LAB_0034c48a;
        if (__n == 10) goto LAB_0034c223;
        if (__n == 4) goto LAB_0034c461;
      }
    }
    else {
      if ((this->super_BrokerBase).identifier._M_string_length == __n) {
        if (__n != 0) goto LAB_0034c128;
      }
      else if (__n != 0) {
        if (__n == 4) {
LAB_0034c461:
          pcVar7 = "root";
        }
        else {
          if (__n != 10) goto LAB_0034c58c;
LAB_0034c223:
          pcVar7 = "federation";
        }
        iVar4 = bcmp(__s1,pcVar7,__n);
        if ((iVar4 != 0) || (((this->super_BrokerBase).field_0x293 & 1) == 0)) goto LAB_0034c58c;
      }
LAB_0034c48a:
      request_00._M_str = local_128._M_str;
      request_00._M_len = local_128._M_len;
      quickBrokerQueries_abi_cxx11_((string *)local_e8,this,request_00);
      if (local_e0 == (_Base_ptr)0x0) {
        bVar3 = true;
        if ((local_128._M_len == 4) && (*(_Rb_tree_color *)local_128._M_str == 0x73676f6c)) {
          local_118[0] = null;
          local_110.object = (object_t *)0x0;
          BrokerBase::addBaseInformation
                    (this_00,(json *)local_118,(bool)(~(this->super_BrokerBase).field_0x293 & 1));
          bufferToJson(&((this->super_BrokerBase).mLogManager.
                         super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->mLogBuffer,(json *)local_118);
          fileops::generateJsonString((string *)__return_storage_ptr__,(json *)local_118,true);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_118);
          goto LAB_0034c566;
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (local_e8 == (undefined1  [8])local_d8) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                        (undefined4)local_d8[0]._M_allocated_capacity);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d8[0]._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e8;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                        (undefined4)local_d8[0]._M_allocated_capacity);
        }
        __return_storage_ptr__->_M_string_length = (size_type)local_e0;
        local_e0 = (_Base_ptr)0x0;
        local_d8[0]._M_allocated_capacity._0_4_ =
             (undefined4)local_d8[0]._M_allocated_capacity & 0xffffff00;
        local_e8 = (undefined1  [8])local_d8;
LAB_0034c566:
        bVar3 = false;
      }
      if (local_e8 != (undefined1  [8])local_d8) {
        operator_delete((void *)local_e8,
                        CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_d8[0]._M_allocated_capacity) + 1);
      }
      if (!bVar3) {
        return __return_storage_ptr__;
      }
    }
LAB_0034c58c:
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Broker has terminated","");
    generateJsonErrorResponse((string *)__return_storage_ptr__,DISCONNECTED,(string *)local_e8);
  }
  if (local_e8 == (undefined1  [8])local_d8) {
    return __return_storage_ptr__;
  }
  local_108._M_allocated_capacity =
       CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                (undefined4)local_d8[0]._M_allocated_capacity);
  auVar8 = local_e8;
LAB_0034c5d2:
  operator_delete((void *)auVar8,local_108._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "broker" || target == getIdentifier() || target.empty() ||
            (target == "root" && _isRoot) || (target == "federation" && _isRoot)) {
            auto res = quickBrokerQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                addBaseInformation(base, !isRoot());
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Broker has terminated");
    }
    auto gid = global_id.load();
    if (target == "broker" || target == getIdentifier() || target.empty()) {
        auto res = quickBrokerQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = querycmd.dest_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(index);
        addActionMessage(std::move(querycmd));
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }
    if (target == "parent") {
        if (isRootc) {
            return generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND,
                                             "broker has no parent");  // LCOV_EXCL_LINE
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        querycmd.messageID = ++queryCounter;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        addActionMessage(querycmd);
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(querycmd.messageID);
        return ret;
    }
    if ((target == "root") || (target == "rootbroker")) {
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        transmitToParent(std::move(querycmd));

        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }

    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gid;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.payload = queryStr;
    querycmd.setStringData(target);
    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    transmitToParent(std::move(querycmd));

    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}